

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

string * __thiscall BayesianGameBase::SoftPrintSummary_abi_cxx11_(BayesianGameBase *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [288];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Bayesian game with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x78));
  poVar1 = std::operator<<(poVar1," agents");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_188,"Number of actions ");
  PrintTools::SoftPrintVector<unsigned_long>(in_stack_ffffffffffffff98);
  std::operator<<(local_188,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  poVar1 = std::operator<<(local_188," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0xb8));
  std::operator<<(poVar1," joint actions)");
  std::operator<<(local_188,"\nNumber of types ");
  PrintTools::SoftPrintVector<unsigned_long>(in_stack_ffffffffffffff98);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  poVar1 = std::operator<<(local_188," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0xb0));
  poVar1 = std::operator<<(poVar1," joint types)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameBase::SoftPrintSummary() const
{
    stringstream ss;
    ss << "Bayesian game with "<<_m_nrAgents<<" agents"<<endl;
    ss << "Number of actions ";
    ss << SoftPrintVector(_m_nrActions);
    ss << " ("<< _m_nrJA <<" joint actions)";
    ss << "\nNumber of types ";
    ss << SoftPrintVector(_m_nrTypes);
    ss << " ("<< _m_nrJTypes <<" joint types)"<<endl;
    return(ss.str());
}